

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int Curl_removeHandleFromPipeline(SessionHandle *handle,curl_llist *pipeline)

{
  curl_llist_element *local_28;
  curl_llist_element *curr;
  curl_llist *pipeline_local;
  SessionHandle *handle_local;
  
  local_28 = pipeline->head;
  while( true ) {
    if (local_28 == (curl_llist_element *)0x0) {
      return 0;
    }
    if ((SessionHandle *)local_28->ptr == handle) break;
    local_28 = local_28->next;
  }
  Curl_llist_remove(pipeline,local_28,(void *)0x0);
  return 1;
}

Assistant:

int Curl_removeHandleFromPipeline(struct SessionHandle *handle,
                                  struct curl_llist *pipeline)
{
  struct curl_llist_element *curr;

  curr = pipeline->head;
  while(curr) {
    if(curr->ptr == handle) {
      Curl_llist_remove(pipeline, curr, NULL);
      return 1; /* we removed a handle */
    }
    curr = curr->next;
  }

  return 0;
}